

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Eol_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *this,bool t_eos)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  Position *this_00;
  
  pcVar1 = (this->m_position).m_pos;
  pcVar2 = (this->m_position).m_end;
  if (pcVar1 == pcVar2) {
    return false;
  }
  this_00 = &this->m_position;
  if ((ulong)((long)pcVar2 - (long)pcVar1) < 2) {
LAB_001b67d9:
    cVar3 = *pcVar1;
  }
  else {
    cVar3 = *pcVar1;
    if (cVar3 == '\r') {
      if (pcVar1[1] == '\n') {
        Position::operator+=(this_00,2);
        goto LAB_001b6803;
      }
      goto LAB_001b67d9;
    }
  }
  if (cVar3 != '\n') {
    if ((pcVar1 != pcVar2 && !t_eos) && (*pcVar1 == ';')) {
      Position::operator++(this_00);
      return true;
    }
    return false;
  }
  Position::operator++(this_00);
LAB_001b6803:
  (this->m_position).col = 1;
  return true;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }